

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O1

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  ulong uVar1;
  int iVar2;
  id tid;
  
  tid._M_thread = pthread_self();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((this->e_owner_)._M_thread == tid._M_thread) {
    (this->e_owner_)._M_thread = 0;
    uVar1 = (this->state_).rwcount;
    if ((long)uVar1 < 0) {
      (this->state_).rwcount = uVar1 & 0x7fffffffffffffff;
      validator::deadlock::unlocked((uintptr_t)this,tid,false);
      std::condition_variable::notify_all();
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return;
    }
    __assert_fail("s.rwcount & writer_mask",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_rwlock_sched.hpp"
                  ,0x50,"static void yamc::rwlock::ReaderPrefer::release_wlock(state &)");
  }
  abort();
}

Assistant:

void unlock()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ != tid) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock");
#endif
    }
    e_owner_ = {};
    RwLockPolicy::release_wlock(state_);
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, false);
    cv_.notify_all();
  }